

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintSmartPointer<SDL_Texture,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>,void>
               (unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *ptr,ostream *os,
               int param_3)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((ptr->_M_t).super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
      super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
      super__Head_base<0UL,_SDL_Texture_*,_false>._M_head_impl == (SDL_Texture_conflict *)0x0) {
    pcVar2 = "(nullptr)";
  }
  else {
    poVar1 = std::operator<<(os,"(ptr = ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,", value = ");
    std::operator<<(os,"(incomplete type)");
    pcVar2 = ")";
  }
  std::operator<<(os,pcVar2);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}